

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O2

void BLAKE2B256_Update(BLAKE2B_CTX *b2b,void *in_data,size_t len)

{
  uint8_t *block;
  size_t sVar1;
  size_t sVar2;
  ulong __n;
  ulong __n_00;
  uint8_t *block_00;
  
  if (len != 0) {
    sVar1 = b2b->block_used;
    __n_00 = -(sVar1 - 0x80);
    if (len <= -(sVar1 - 0x80)) {
      __n_00 = len;
    }
    block = b2b->block;
    sVar2 = 0x80;
    if (sVar1 != 0x80) {
      memcpy(block + sVar1,in_data,__n_00);
      sVar2 = b2b->block_used;
    }
    b2b->block_used = sVar2 + __n_00;
    __n = len - __n_00;
    if (__n != 0) {
      if (sVar2 + __n_00 != 0x80) {
        __assert_fail("b2b->block_used == BLAKE2B_CBLOCK",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/blake2/blake2.cc"
                      ,0x8b,"void BLAKE2B256_Update(BLAKE2B_CTX *, const void *, size_t)");
      }
      block_00 = (uint8_t *)((long)in_data + __n_00);
      blake2b_transform(b2b,block,0x80,0);
      b2b->block_used = 0;
      for (; 0x80 < __n; __n = __n - 0x80) {
        blake2b_transform(b2b,block_00,0x80,0);
        block_00 = block_00 + 0x80;
      }
      memcpy(block,block_00,__n);
      b2b->block_used = __n;
    }
  }
  return;
}

Assistant:

void BLAKE2B256_Update(BLAKE2B_CTX *b2b, const void *in_data, size_t len) {
  if (len == 0) {
    // Work around a C language bug. See https://crbug.com/1019588.
    return;
  }

  const uint8_t *data = reinterpret_cast<const uint8_t *>(in_data);
  size_t todo = sizeof(b2b->block) - b2b->block_used;
  if (todo > len) {
    todo = len;
  }
  OPENSSL_memcpy(&b2b->block[b2b->block_used], data, todo);
  b2b->block_used += todo;
  data += todo;
  len -= todo;

  if (!len) {
    return;
  }

  // More input remains therefore we must have filled |b2b->block|.
  assert(b2b->block_used == BLAKE2B_CBLOCK);
  blake2b_transform(b2b, b2b->block, BLAKE2B_CBLOCK,
                    /*is_final_block=*/0);
  b2b->block_used = 0;

  while (len > BLAKE2B_CBLOCK) {
    blake2b_transform(b2b, data, BLAKE2B_CBLOCK, /*is_final_block=*/0);
    data += BLAKE2B_CBLOCK;
    len -= BLAKE2B_CBLOCK;
  }

  OPENSSL_memcpy(b2b->block, data, len);
  b2b->block_used = len;
}